

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O1

void PackRGB_C(uint8_t *r,uint8_t *g,uint8_t *b,int len,int step,uint32_t *out)

{
  ulong uVar1;
  long lVar2;
  
  if (0 < len) {
    uVar1 = 0;
    lVar2 = 0;
    do {
      out[uVar1] = (uint)g[lVar2] << 8 | (uint)r[lVar2] << 0x10 | (uint)b[lVar2] | 0xff000000;
      lVar2 = lVar2 + step;
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
  }
  return;
}

Assistant:

static void PackRGB_C(const uint8_t* WEBP_RESTRICT r,
                      const uint8_t* WEBP_RESTRICT g,
                      const uint8_t* WEBP_RESTRICT b,
                      int len, int step, uint32_t* WEBP_RESTRICT out) {
  int i, offset = 0;
  for (i = 0; i < len; ++i) {
    out[i] = MakeARGB32(0xff, r[offset], g[offset], b[offset]);
    offset += step;
  }
}